

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSharedDestructorCode
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  pointer ppFVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  FieldGenerator *pFVar5;
  pointer ppFVar6;
  Iterator __begin3;
  Formatter format;
  Iterator __end3;
  Iterator local_88;
  Formatter local_78;
  Iterator local_40;
  
  pDVar1 = this->descriptor_;
  FVar4 = GetOptimizeFor(*(FileDescriptor **)(pDVar1 + 0x10),&this->options_,(bool *)0x0);
  if (((FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME) || (*(int *)(pDVar1 + 0x78) != 0)) ||
     (*(int *)(pDVar1 + 4) != 0)) {
    local_78.printer_ = printer;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_78.vars_._M_t,&(this->variables_)._M_t);
    Formatter::operator()<>(&local_78,"inline void $classname$::SharedDtor() {\n");
    io::Printer::Indent(local_78.printer_);
    Formatter::operator()<>(&local_78,"$DCHK$(GetArenaForAllocation() == nullptr);\n");
    ppFVar6 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar2 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar6 != ppFVar2) {
      do {
        pFVar5 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar6);
        (*pFVar5->_vptr_FieldGenerator[0x10])(pFVar5,printer);
        ppFVar6 = ppFVar6 + 1;
      } while (ppFVar6 != ppFVar2);
    }
    local_88.descriptor = this->descriptor_;
    local_88.idx = 0;
    local_40.idx = *(int *)(local_88.descriptor + 0x6c);
    local_40.descriptor = local_88.descriptor;
    while( true ) {
      bVar3 = operator==(&local_88,&local_40);
      if (bVar3) break;
      Formatter::operator()
                (&local_78,"if (has_$1$()) {\n  clear_$1$();\n}\n",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  (*(long *)(local_88.descriptor + 0x30) + 8 + (long)local_88.idx * 0x28));
      local_88.idx = local_88.idx + 1;
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>(&local_78,"_weak_field_map_.ClearAll();\n");
    }
    io::Printer::Outdent(local_78.printer_);
    Formatter::operator()<>(&local_78,"}\n\n");
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_78.vars_._M_t);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSharedDestructorCode(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  format("inline void $classname$::SharedDtor() {\n");
  format.Indent();
  format("$DCHK$(GetArenaForAllocation() == nullptr);\n");
  // Write the destructors for each field except oneof members.
  // optimized_order_ does not contain oneof fields.
  for (auto field : optimized_order_) {
    field_generators_.get(field).GenerateDestructorCode(printer);
  }

  // Generate code to destruct oneofs. Clearing should do the work.
  for (auto oneof : OneOfRange(descriptor_)) {
    format(
        "if (has_$1$()) {\n"
        "  clear_$1$();\n"
        "}\n",
        oneof->name());
  }

  if (num_weak_fields_) {
    format("_weak_field_map_.ClearAll();\n");
  }
  format.Outdent();
  format(
      "}\n"
      "\n");
}